

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

gs_val_t * gs_eval_expr_call(gs_val_t *__return_storage_ptr__,gs_eval_t *eval,gs_expr_t *expr)

{
  vec2 *pvVar1;
  char *key;
  gs_val_t val;
  int iVar2;
  gs_stmt_type *pgVar3;
  gs_val_t local_108;
  gs_val_t local_f0;
  undefined1 local_d8 [8];
  gs_val_t arg_val_1;
  undefined1 auStack_b8 [4];
  int i_1;
  anon_union_16_10_4eabebd3_for_gs_val_2 local_b0;
  gs_val_t local_a0;
  undefined1 local_88 [8];
  gs_val_t arg_val;
  gs_val_type decl_type;
  char *symbol;
  undefined1 auStack_58 [4];
  int i;
  anon_union_16_10_4eabebd3_for_gs_val_2 local_50;
  gs_stmt_t *local_40;
  gs_stmt_t *fn_stmt;
  vec_gs_val_t vals;
  gs_env_t *env;
  gs_expr_t *expr_local;
  gs_eval_t *eval_local;
  
  vals.alloc_category =
       (char *)golf_alloc_tracked(0x38,
                                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/script.c"
                                 );
  memset(vals.alloc_category,0,0x38);
  *(char **)(vals.alloc_category + 0x30) = "script/eval";
  memset(&fn_stmt,0,0x18);
  vals._8_8_ = anon_var_dwarf_24b1f;
  gs_eval_expr(__return_storage_ptr__,eval,(expr->field_2).assignment.left);
  if ((__return_storage_ptr__->is_return & 1U) == 0) {
    if (__return_storage_ptr__->type == GS_VAL_FN) {
      local_40 = (__return_storage_ptr__->field_2).fn_stmt;
      if ((expr->field_2).call.num_args == (local_40->field_1).fn_decl.num_args) {
        for (symbol._4_4_ = 0; symbol._4_4_ < (local_40->field_1).fn_decl.num_args;
            symbol._4_4_ = symbol._4_4_ + 1) {
          key = *(char **)&(&((local_40->field_1).for_stmt.inc)->token)[symbol._4_4_].col;
          arg_val.field_2._12_4_ = (&((local_40->field_1).for_stmt.cond)->type)[symbol._4_4_];
          gs_eval_expr((gs_val_t *)local_88,eval,
                       *(gs_expr_t **)
                        (&((expr->field_2).binary_op.right)->type + (long)symbol._4_4_ * 2));
          if (((ulong)local_88 & 0x100000000) != 0) {
            __return_storage_ptr__->type = local_88._0_4_;
            __return_storage_ptr__->is_return = (_Bool)local_88[4];
            *(undefined3 *)&__return_storage_ptr__->field_0x5 = local_88._5_3_;
            (__return_storage_ptr__->field_2).vec2_val = (vec2)arg_val._0_8_;
            *(vec2 *)((long)&__return_storage_ptr__->field_2 + 8) = arg_val.field_2.vec2_val;
            goto LAB_0015c6bf;
          }
          val.field_2.vec2_val = (vec2)arg_val._0_8_;
          val.type = local_88._0_4_;
          val.is_return = (_Bool)local_88[4];
          val._5_3_ = local_88._5_3_;
          val.field_2._8_8_ = arg_val.field_2.list_val;
          gs_eval_cast(&local_a0,eval,val,arg_val.field_2._12_4_);
          local_88._0_4_ = local_a0.type;
          local_88[4] = local_a0.is_return;
          local_88._5_3_ = local_a0._5_3_;
          arg_val._0_8_ = local_a0.field_2.vec2_val;
          arg_val.field_2._0_4_ = local_a0.field_2.vec3_val.z;
          arg_val.field_2._4_4_ = local_a0.field_2._12_4_;
          if ((local_a0._0_8_ & 0x100000000) != 0) {
            __return_storage_ptr__->type = local_a0.type;
            __return_storage_ptr__->is_return = local_a0.is_return;
            *(undefined3 *)&__return_storage_ptr__->field_0x5 = local_a0._5_3_;
            (__return_storage_ptr__->field_2).vec2_val = local_a0.field_2.vec2_val;
            pvVar1 = (vec2 *)((long)&__return_storage_ptr__->field_2 + 8);
            pvVar1->x = (float)local_a0.field_2._8_4_;
            pvVar1->y = (float)local_a0.field_2._12_4_;
            goto LAB_0015c6bf;
          }
          *(undefined8 *)(vals.alloc_category + 0x18) = local_a0._0_8_;
          *(vec2 *)(vals.alloc_category + 0x20) = local_a0.field_2.vec2_val;
          ((vec2 *)(vals.alloc_category + 0x28))->x = (float)local_a0.field_2._8_4_;
          ((vec2 *)(vals.alloc_category + 0x28))->y = (float)local_a0.field_2._12_4_;
          map_set_((map_base_t *)vals.alloc_category,key,vals.alloc_category + 0x18,0x18,
                   *(char **)(vals.alloc_category + 0x30));
        }
        iVar2 = vec_expand_((char **)&eval->env,&(eval->env).length,&(eval->env).capacity,8,
                            (eval->env).alloc_category);
        if (iVar2 == 0) {
          iVar2 = (eval->env).length;
          (eval->env).length = iVar2 + 1;
          (eval->env).data[iVar2] = (gs_env_t *)vals.alloc_category;
        }
        gs_eval_stmt((gs_val_t *)auStack_b8,eval,(local_40->field_1).for_stmt.body);
        __return_storage_ptr__->type = (gs_val_type)auStack_b8;
        __return_storage_ptr__->is_return = i_1._0_1_;
        *(undefined3 *)&__return_storage_ptr__->field_0x5 = i_1._1_3_;
        (__return_storage_ptr__->field_2).vec2_val = local_b0.vec2_val;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_b0._8_8_;
        if (__return_storage_ptr__->type != GS_VAL_ERROR) {
          __return_storage_ptr__->is_return = false;
        }
        (eval->env).length = (eval->env).length + -1;
      }
      else {
        gs_val_error((gs_val_t *)auStack_58,"Wrong number of args passed to function call");
        __return_storage_ptr__->type = (gs_val_type)auStack_58;
        __return_storage_ptr__->is_return = i._0_1_;
        *(undefined3 *)&__return_storage_ptr__->field_0x5 = i._1_3_;
        (__return_storage_ptr__->field_2).vec2_val = local_50.vec2_val;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_50._8_8_;
      }
    }
    else if (__return_storage_ptr__->type == GS_VAL_C_FN) {
      for (arg_val_1.field_2._12_4_ = 0;
          (int)arg_val_1.field_2._12_4_ < (expr->field_2).call.num_args;
          arg_val_1.field_2._12_4_ = arg_val_1.field_2._12_4_ + 1) {
        gs_eval_expr((gs_val_t *)local_d8,eval,
                     *(gs_expr_t **)
                      (&((expr->field_2).binary_op.right)->type +
                      (long)(int)arg_val_1.field_2._12_4_ * 2));
        if ((local_d8._4_4_ & 1) != 0) {
          __return_storage_ptr__->type = local_d8._0_4_;
          __return_storage_ptr__->is_return = (_Bool)(char)local_d8._4_4_;
          *(int3 *)&__return_storage_ptr__->field_0x5 = SUB43(local_d8._4_4_,1);
          (__return_storage_ptr__->field_2).vec2_val = (vec2)arg_val_1._0_8_;
          *(vec2 *)((long)&__return_storage_ptr__->field_2 + 8) = arg_val_1.field_2.vec2_val;
          goto LAB_0015c6bf;
        }
        iVar2 = vec_expand_((char **)&fn_stmt,(int *)&vals,(int *)((long)&vals.data + 4),0x18,
                            (char *)vals._8_8_);
        if (iVar2 == 0) {
          pgVar3 = &fn_stmt->type + (long)(int)vals.data * 6;
          *(ulong *)pgVar3 = CONCAT44(local_d8._4_4_,local_d8._0_4_);
          ((anon_union_64_7_6f7faa3d_for_gs_stmt_1 *)(pgVar3 + 2))->expr =
               (gs_expr_t *)arg_val_1._0_8_;
          *(vec2 *)(pgVar3 + 4) = arg_val_1.field_2.vec2_val;
          vals.data._0_4_ = (int)vals.data + 1;
        }
      }
      (*(__return_storage_ptr__->field_2).c_fn)(&local_f0,eval,(gs_val_t *)fn_stmt,(int)vals.data);
      __return_storage_ptr__->type = local_f0.type;
      __return_storage_ptr__->is_return = local_f0.is_return;
      *(undefined3 *)&__return_storage_ptr__->field_0x5 = local_f0._5_3_;
      (__return_storage_ptr__->field_2).vec2_val = local_f0.field_2.vec2_val;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_f0.field_2._8_8_;
      if (__return_storage_ptr__->type != GS_VAL_ERROR) {
        __return_storage_ptr__->is_return = false;
      }
    }
    else {
      gs_val_error(&local_108,"Expected a function when evaling call expr");
      __return_storage_ptr__->type = local_108.type;
      __return_storage_ptr__->is_return = local_108.is_return;
      *(undefined3 *)&__return_storage_ptr__->field_0x5 = local_108._5_3_;
      (__return_storage_ptr__->field_2).vec2_val = local_108.field_2.vec2_val;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_108.field_2._8_8_;
    }
  }
LAB_0015c6bf:
  map_deinit_((map_base_t *)vals.alloc_category);
  golf_free_tracked(vals.alloc_category);
  golf_free_tracked(fn_stmt);
  return __return_storage_ptr__;
}

Assistant:

static gs_val_t gs_eval_expr_call(gs_eval_t *eval, gs_expr_t *expr) {
    gs_env_t *env = golf_alloc(sizeof(gs_env_t));
    map_init(&env->val_map, "script/eval");

    vec_gs_val_t vals;
    vec_init(&vals, "script/eval");

    gs_val_t val = gs_eval_expr(eval, expr->call.fn);
    if (val.is_return) goto cleanup;

    if (val.type == GS_VAL_FN) {
        gs_stmt_t *fn_stmt = (gs_stmt_t*) val.fn_stmt;
        if (expr->call.num_args != fn_stmt->fn_decl.num_args) {
            val = gs_val_error("Wrong number of args passed to function call");
            goto cleanup;
        }

        for (int i = 0; i < fn_stmt->fn_decl.num_args; i++) {
            const char *symbol = fn_stmt->fn_decl.arg_symbols[i].symbol;
            gs_val_type decl_type = fn_stmt->fn_decl.arg_types[i];
            gs_val_t arg_val = gs_eval_expr(eval, expr->call.args[i]);
            if (arg_val.is_return) {
                val = arg_val;
                goto cleanup;
            }

            arg_val = gs_eval_cast(eval, arg_val, decl_type);
            if (arg_val.is_return) {
                val = arg_val;
                goto cleanup;
            }

            map_set(&env->val_map, symbol, arg_val);
        }

        vec_push(&eval->env, env);
        val = gs_eval_stmt(eval, fn_stmt->fn_decl.body);
        if (val.type != GS_VAL_ERROR) val.is_return = false;
        (void)vec_pop(&eval->env);
    }
    else if (val.type == GS_VAL_C_FN) {
        for (int i = 0; i < expr->call.num_args; i++) {
            gs_val_t arg_val = gs_eval_expr(eval, expr->call.args[i]);
            if (arg_val.is_return) {
                val = arg_val;
                goto cleanup;
            }
            vec_push(&vals, arg_val);
        }

        val = val.c_fn(eval, vals.data, vals.length);
        if (val.type != GS_VAL_ERROR) val.is_return = false;
    }
    else {
        val = gs_val_error("Expected a function when evaling call expr");
        goto cleanup;
    }

cleanup:
    map_deinit(&env->val_map);
    golf_free(env);
    vec_deinit(&vals);
    return val;
}